

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obudec.c
# Opt level: O0

int obudec_read_leb128(AvxInputContext *input_ctx,uint8_t *value_buffer,size_t *value_length,
                      uint64_t *value,_Bool buffered)

{
  byte bVar1;
  _Bool _Var2;
  AvxInputContext *in_RCX;
  long *in_RDX;
  uint8_t *in_RSI;
  long in_RDI;
  byte in_R8B;
  size_t num_read;
  size_t len;
  size_t in_stack_ffffffffffffffc0;
  uchar *buf;
  undefined7 in_stack_ffffffffffffffd0;
  int local_4;
  
  bVar1 = in_R8B & 1;
  if ((((in_RDI == 0) || (in_RSI == (uint8_t *)0x0)) || (in_RDX == (long *)0x0)) ||
     (in_RCX == (AvxInputContext *)0x0)) {
    local_4 = -1;
  }
  else {
    for (buf = (uchar *)0x0; buf < (uchar *)0x8; buf = buf + 1) {
      in_stack_ffffffffffffffc0 =
           buffer_input(in_RCX,CONCAT17(bVar1,in_stack_ffffffffffffffd0),buf,
                        SUB81(in_stack_ffffffffffffffc0 >> 0x38,0));
      if (in_stack_ffffffffffffffc0 == 0) {
        if ((buf == (uchar *)0x0) && (_Var2 = input_eof((AvxInputContext *)0x0), _Var2)) {
          *in_RDX = 0;
          return 0;
        }
        return -1;
      }
      if ((int)(uint)in_RSI[(long)buf] >> 7 == 0) {
        buf = buf + 1;
        *in_RDX = (long)buf;
        break;
      }
    }
    local_4 = aom_uleb_decode(in_RSI,(size_t)buf,(uint64_t *)in_RCX,(size_t *)0x0);
  }
  return local_4;
}

Assistant:

static int obudec_read_leb128(struct AvxInputContext *input_ctx,
                              uint8_t *value_buffer, size_t *value_length,
                              uint64_t *value, bool buffered) {
  if (!input_ctx || !value_buffer || !value_length || !value) return -1;
  size_t len;
  for (len = 0; len < OBU_MAX_LENGTH_FIELD_SIZE; ++len) {
    const size_t num_read =
        buffer_input(input_ctx, 1, &value_buffer[len], buffered);
    if (num_read == 0) {
      if (len == 0 && input_eof(input_ctx)) {
        *value_length = 0;
        return 0;
      }
      // Ran out of data before completing read of value.
      return -1;
    }
    if ((value_buffer[len] >> 7) == 0) {
      ++len;
      *value_length = len;
      break;
    }
  }

  return aom_uleb_decode(value_buffer, len, value, NULL);
}